

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O2

float diff_y(float (*floatpic) [512] [512],float *kernel,int x,int y,int n)

{
  long lVar1;
  float fVar2;
  
  fVar2 = 0.0;
  for (lVar1 = (long)-n; lVar1 <= n; lVar1 = lVar1 + 1) {
    fVar2 = fVar2 + kernel[lVar1 + 2] * floatpic[2][x][y + lVar1];
  }
  return fVar2;
}

Assistant:

float diff_y(
float floatpic[PIC_T][PIC_X][PIC_Y],
float kernel[5],
int x, int y, int n)
{
int i;
float sum;

sum = 0.0;
for(i=(-n);i<=n;i++)
	{
	sum += kernel[i+2]*floatpic[2][x][y+i];
	}
return(sum);
}